

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_dds.cxx
# Opt level: O0

bool __thiscall xray_re::xr_image::save_dds(xr_image *this,xr_writer *w,irect *rect)

{
  undefined1 auVar1 [16];
  bool bVar2;
  ulong uVar3;
  Compressor local_80;
  undefined1 local_78 [8];
  dds_writer dds;
  OutputOptions out_opts;
  CompressionOptions comp_opts;
  InputOptions local_48;
  InputOptions in_opts;
  rgba32 *prStack_38;
  int i;
  rgba32 *src_data;
  rgba32 *data;
  int height;
  int width;
  irect *rect_local;
  xr_writer *w_local;
  xr_image *this_local;
  
  if (rect == (irect *)0x0) {
    data._4_4_ = this->m_width;
    data._0_4_ = this->m_height;
    src_data = this->m_data;
  }
  else {
    data._4_4_ = ((rect->field_0).field_1.x2 - (rect->field_0).field_1.x1) + 1U & 0x7fffffff;
    data._0_4_ = ((rect->field_0).field_1.y2 - (rect->field_0).field_1.y1) + 1U & 0x7fffffff;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(int)(data._4_4_ * (uint)data);
    uVar3 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    src_data = (rgba32 *)operator_new__(uVar3);
    prStack_38 = this->m_data +
                 ((rect->field_0).field_1.y1 * this->m_width + (rect->field_0).field_1.x1);
    for (in_opts.m._4_4_ = 0; in_opts.m._4_4_ != (uint)data; in_opts.m._4_4_ = in_opts.m._4_4_ + 1)
    {
      memcpy(src_data + (int)(in_opts.m._4_4_ * data._4_4_),prStack_38,(long)(int)data._4_4_ << 2);
      prStack_38 = prStack_38 + this->m_width;
    }
  }
  nvtt::InputOptions::InputOptions(&local_48);
  nvtt::InputOptions::setTextureLayout(&local_48,TextureType_2D,data._4_4_,(uint)data,1);
  nvtt::InputOptions::setWrapMode(&local_48,WrapMode_Clamp);
  nvtt::InputOptions::setMipmapData(&local_48,src_data,data._4_4_,(uint)data,1,0,0);
  if ((src_data != this->m_data) && (src_data != (rgba32 *)0x0)) {
    operator_delete__(src_data);
  }
  nvtt::InputOptions::setNormalMap(&local_48,false);
  nvtt::InputOptions::setConvertToNormalMap(&local_48,false);
  nvtt::InputOptions::setGamma(&local_48,2.2,2.2);
  nvtt::InputOptions::setNormalizeMipmaps(&local_48,false);
  nvtt::CompressionOptions::CompressionOptions((CompressionOptions *)&out_opts);
  nvtt::CompressionOptions::setFormat((CompressionOptions *)&out_opts,Format_BC3);
  nvtt::CompressionOptions::setQuality((CompressionOptions *)&out_opts,Quality_Highest);
  nvtt::OutputOptions::OutputOptions((OutputOptions *)&dds.w);
  dds_writer::dds_writer((dds_writer *)local_78,w);
  nvtt::OutputOptions::setOutputHandler((OutputOptions *)&dds.w,(OutputHandler *)local_78);
  nvtt::OutputOptions::setErrorHandler((OutputOptions *)&dds.w,(ErrorHandler *)0x0);
  nvtt::Compressor::Compressor(&local_80);
  bVar2 = nvtt::Compressor::process
                    (&local_80,&local_48,(CompressionOptions *)&out_opts,(OutputOptions *)&dds.w);
  nvtt::Compressor::~Compressor(&local_80);
  dds_writer::~dds_writer((dds_writer *)local_78);
  nvtt::OutputOptions::~OutputOptions((OutputOptions *)&dds.w);
  nvtt::CompressionOptions::~CompressionOptions((CompressionOptions *)&out_opts);
  nvtt::InputOptions::~InputOptions(&local_48);
  return bVar2;
}

Assistant:

bool xr_image::save_dds(xr_writer& w, const irect* rect) const
{
#if 1
	int width, height;
	rgba32* data;
	if (rect) {
		width = int((rect->x2 - rect->x1 + 1) & INT_MAX);
		height = int((rect->y2 - rect->y1 + 1) & INT_MAX);
		data = new rgba32[width * height];
		const rgba32* src_data = &m_data[rect->y1*m_width + rect->x1];
		for (int i = 0; i != height; ++i) {
			memcpy(&data[i*width], src_data, width*sizeof(rgba32));
			src_data += m_width;
		}
	} else {
		width = m_width;
		height = m_height;
		data = m_data;
	}
#else
	int width = int(m_width & INT_MAX);
	int height = int(m_height & INT_MAX);
	const rgba32* data = m_data;
#endif

	nvtt::InputOptions in_opts;
	in_opts.setTextureLayout(nvtt::TextureType_2D, width, height);
	in_opts.setWrapMode(nvtt::WrapMode_Clamp);
	in_opts.setMipmapData(data, width, height);
	if (data != m_data)
		delete[] data;
	in_opts.setNormalMap(false);
	in_opts.setConvertToNormalMap(false);
	in_opts.setGamma(2.2f, 2.2f);
	in_opts.setNormalizeMipmaps(false);

	nvtt::CompressionOptions comp_opts;
	comp_opts.setFormat(nvtt::Format_BC3);
	comp_opts.setQuality(nvtt::Quality_Highest);

	nvtt::OutputOptions out_opts;
	dds_writer dds(w);
	out_opts.setOutputHandler(&dds);
	out_opts.setErrorHandler(0);

	return nvtt::Compressor().process(in_opts, comp_opts, out_opts);
}